

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.h
# Opt level: O2

LinearKernel * __thiscall CoreML::Specification::Kernel::mutable_linearkernel(Kernel *this)

{
  LinearKernel *this_00;
  
  if (this->_oneof_case_[0] == 1) {
    this_00 = (this->kernel_).linearkernel_;
  }
  else {
    clear_kernel(this);
    this->_oneof_case_[0] = 1;
    this_00 = (LinearKernel *)operator_new(0x18);
    LinearKernel::LinearKernel(this_00);
    (this->kernel_).linearkernel_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::LinearKernel* Kernel::mutable_linearkernel() {
  if (!has_linearkernel()) {
    clear_kernel();
    set_has_linearkernel();
    kernel_.linearkernel_ = new ::CoreML::Specification::LinearKernel;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Kernel.linearKernel)
  return kernel_.linearkernel_;
}